

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O3

void start_scope(LinearizerState *linearizer,Proc *proc,Scope *scope)

{
  uint uVar1;
  ravitype_t type;
  uint uVar2;
  Proc *pPVar3;
  Scope *pSVar4;
  int iVar5;
  PtrListIterator symiter__;
  PtrListIterator PStack_38;
  
  (linearizer->C_declarations).pos = (size_t)proc;
  raviX_ptrlist_forward_iterator(&PStack_38,*(PtrList **)&proc->id);
  pPVar3 = (Proc *)raviX_ptrlist_iter_next(&PStack_38);
  do {
    if (pPVar3 == (Proc *)0x0) {
      return;
    }
    if (pPVar3->node_count == 0) {
      if ((((ulong)pPVar3->function_expr & 3) == 0) &&
         ((type = *(ravitype_t *)&pPVar3->nodes, type == RAVI_TNUMFLT || (type == RAVI_TNUMINT)))) {
        pSVar4 = (Scope *)allocate_temp_pseudo((Proc *)linearizer,type,true);
        pPVar3->current_scope = pSVar4;
        ((anon_union_40_9_1ec7a544_for_Pseudo_3 *)&pSVar4->parent)->proc = pPVar3;
      }
      else {
        uVar2 = 3;
        iVar5 = -0x101;
        do {
          if ((&linearizer[1].current_proc)[uVar2] != (Proc *)0x0) {
            uVar2 = -((int)LZCOUNT((ulong)(&linearizer[1].current_proc)[uVar2] >> 1) + iVar5);
            goto LAB_00116f90;
          }
          uVar2 = uVar2 - 1;
          iVar5 = iVar5 + 0x40;
        } while (iVar5 != -1);
        uVar2 = 0;
LAB_00116f90:
        (&linearizer[1].current_proc)[uVar2 >> 6] =
             (Proc *)((ulong)(&linearizer[1].current_proc)[uVar2 >> 6] | 1L << ((ulong)uVar2 & 0x3f)
                     );
        uVar1 = (uint)linearizer[1].C_declarations.pos;
        if (uVar1 < uVar2) {
          __assert_fail("reg <= generator->max_reg",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                        ,0xac,"unsigned int pseudo_gen_alloc(PseudoGenerator *, _Bool)");
        }
        if (uVar2 == uVar1) {
          *(uint *)&linearizer[1].C_declarations.pos = uVar2 + 1;
        }
        allocate_symbol_pseudo
                  (*(Proc **)**(long **)linearizer->current_proc,
                   (LuaSymbol *)((undefined8 *)**(long **)linearizer->current_proc)[2],(uint)pPVar3)
        ;
      }
    }
    pPVar3 = (Proc *)raviX_ptrlist_iter_next(&PStack_38);
  } while( true );
}

Assistant:

static void start_scope(LinearizerState *linearizer, Proc *proc, Scope *scope)
{
	proc->current_scope = scope;
	LuaSymbol *sym;
	FOR_EACH_PTR(scope->symbol_list, LuaSymbol, sym)
	{
		if (sym->symbol_type == SYM_LOCAL) {
			uint8_t reg;
			if (!sym->variable.escaped && !sym->variable.function_parameter &&
			    (sym->variable.value_type.type_code == RAVI_TNUMFLT ||
			     sym->variable.value_type.type_code == RAVI_TNUMINT)) {
				Pseudo *pseudo;
				if (sym->variable.value_type.type_code == RAVI_TNUMFLT)
					pseudo = allocate_temp_pseudo(proc, RAVI_TNUMFLT, true);
				else
					pseudo = allocate_temp_pseudo(proc, RAVI_TNUMINT, true);
				sym->variable.pseudo = pseudo;
				pseudo->temp_for_local = sym; /* Note that this temp is for a local */
			}
			else {
				reg = allocate_register(&proc->local_pseudos, true);
				allocate_symbol_pseudo(proc, sym, reg);
			}
		}
	}
	END_FOR_EACH_PTR(sym)
}